

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::IdentifierSelectNameSyntax::setChild
          (IdentifierSelectNameSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  Token TVar4;
  
  if (index == 0) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->identifier).kind = TVar4.kind;
    (this->identifier).field_0x2 = TVar4._2_1_;
    (this->identifier).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->identifier).rawLen = TVar4.rawLen;
    (this->identifier).info = TVar4.info;
  }
  else {
    pSVar3 = TokenOrSyntax::node(&child);
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->selectors).super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)&(this->selectors).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->selectors).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->selectors).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar3->previewNode;
    (this->selectors).super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->selectors).super_span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL>.
    _M_ptr = (pointer)pSVar3[1].parent;
    (this->selectors).super_span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL>.
    _M_extent._M_extent_value = (size_t)pSVar1;
  }
  return;
}

Assistant:

void IdentifierSelectNameSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: identifier = child.token(); return;
        case 1: selectors = child.node()->as<SyntaxList<ElementSelectSyntax>>(); return;
        default: SLANG_UNREACHABLE;
    }
}